

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

uint64_t internal_exr_huf_compress_spare_bytes(void)

{
  return 0x1c001c;
}

Assistant:

uint64_t
internal_exr_huf_compress_spare_bytes (void)
{
    uint64_t ret = 0;
    ret += HUF_ENCSIZE * sizeof (uint64_t);  // freq
    ret += HUF_ENCSIZE * sizeof (uint64_t);  // scode
    ret += HUF_ENCSIZE * sizeof (uint64_t*); // fheap
    ret += HUF_ENCSIZE * sizeof (uint32_t);  // hlink
    return ret;
}